

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_pack4x8_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  Id arg;
  Builder *this;
  Value *pVVar5;
  Type *type;
  Operation *pOVar6;
  Operation *this_00;
  uint i;
  long lVar7;
  uint32_t clamp_op_literal;
  Id local_9c;
  Vector<spv::Id> hi_ids;
  Id local_78;
  Id IStack_74;
  Id IStack_70;
  Id IStack_6c;
  Vector<spv::Id> lo_ids;
  Id elements [4];
  
  this = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this,CapabilityInt8);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  type = LLVMBC::Value::getType(pVVar5);
  IVar2 = Converter::Impl::get_type_id(impl,type,0);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,&clamp_op_literal);
  if (bVar1) {
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar7 + 2);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      elements[lVar7] = IVar3;
    }
    IVar2 = Converter::Impl::build_vector(impl,IVar2,elements,4);
    if (clamp_op_literal != 0) {
      if (impl->glsl_std450_ext == 0) {
        IVar3 = spv::Builder::import(this,"GLSL.std.450");
        impl->glsl_std450_ext = IVar3;
      }
      local_9c = IVar2;
      uVar4 = LLVMBC::Type::getIntegerBitWidth(type);
      if (uVar4 == 0x10) {
        IVar2 = spv::Builder::makeInt16Constant
                          (this,(ushort)(clamp_op_literal == 1) * 0x80 + -0x80,false);
        IVar3 = spv::Builder::makeInt16Constant
                          (this,(ushort)(clamp_op_literal == 1) << 7 | 0x7f,false);
      }
      else {
        IVar2 = spv::Builder::makeIntConstant
                          (this,(uint)(clamp_op_literal == 1) * 0x80 + -0x80,false);
        IVar3 = spv::Builder::makeIntConstant(this,(uint)(clamp_op_literal == 1) << 7 | 0x7f,false);
      }
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start._4_4_ = IVar2;
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start._0_4_ = IVar2;
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = IVar2;
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish._4_4_ = IVar2;
      lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&lo_ids,
                 &hi_ids);
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      hi_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = IVar3;
      IStack_74 = IVar3;
      IStack_70 = IVar3;
      IStack_6c = IVar3;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&hi_ids,
                 &local_78);
      uVar4 = LLVMBC::Type::getIntegerBitWidth(type);
      IVar2 = spv::Builder::makeIntType(this,uVar4);
      IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
      IVar3 = spv::Builder::makeCompositeConstant(this,IVar2,&lo_ids,false);
      arg = spv::Builder::makeCompositeConstant(this,IVar2,(Vector<Id> *)&hi_ids,false);
      pOVar6 = Converter::Impl::allocate(impl,OpExtInst,IVar2);
      Operation::add_id(pOVar6,impl->glsl_std450_ext);
      Operation::add_literal(pOVar6,0x2d);
      Operation::add_id(pOVar6,local_9c);
      Operation::add_id(pOVar6,IVar3);
      Operation::add_id(pOVar6,arg);
      Converter::Impl::add(impl,pOVar6,false);
      IVar2 = pOVar6->id;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                (&hi_ids.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                (&lo_ids.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
    }
    IVar3 = spv::Builder::makeUintType(this,8);
    IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
    pOVar6 = Converter::Impl::allocate(impl,OpUConvert,IVar3);
    Operation::add_id(pOVar6,IVar2);
    Converter::Impl::add(impl,pOVar6,false);
    this_00 = Converter::Impl::allocate(impl,OpBitcast,(Value *)instruction);
    Operation::add_id(this_00,pOVar6->id);
    Converter::Impl::add(impl,this_00,false);
  }
  return bVar1;
}

Assistant:

bool emit_pack4x8_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityInt8);

	auto *element_type = instruction->getOperand(2)->getType();
	spv::Id uint_type = impl.get_type_id(element_type);

	uint32_t clamp_op_literal;
	if (!get_constant_operand(instruction, 1, &clamp_op_literal))
		return false;

	spv::Id elements[4];
	for (unsigned i = 0; i < 4; i++)
		elements[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id vec_id = impl.build_vector(uint_type, elements, 4);
	if (clamp_op_literal != 0)
	{
		// Signed saturate with u8 range or s8 range.
		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		spv::Id lo_id, hi_id;
		if (element_type->getIntegerBitWidth() == 16)
		{
			lo_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 255 : 127);
		}
		else
		{
			lo_id = builder.makeIntConstant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeIntConstant(clamp_op_literal == 1 ? 255 : 127);
		}

		Vector<spv::Id> lo_ids = { lo_id, lo_id, lo_id, lo_id };
		Vector<spv::Id> hi_ids = { hi_id, hi_id, hi_id, hi_id };

		spv::Id int_type = builder.makeIntType(element_type->getIntegerBitWidth());
		spv::Id int4_type = builder.makeVectorType(int_type, 4);
		lo_id = builder.makeCompositeConstant(int4_type, lo_ids);
		hi_id = builder.makeCompositeConstant(int4_type, hi_ids);

		auto *clamp_op = impl.allocate(spv::OpExtInst, int4_type);
		clamp_op->add_id(impl.glsl_std450_ext);
		clamp_op->add_literal(GLSLstd450SClamp);
		clamp_op->add_id(vec_id);
		clamp_op->add_id(lo_id);
		clamp_op->add_id(hi_id);
		impl.add(clamp_op);
		vec_id = clamp_op->id;
	}

	auto *narrow_op = impl.allocate(spv::OpUConvert, builder.makeVectorType(builder.makeUintType(8), 4));
	narrow_op->add_id(vec_id);
	impl.add(narrow_op);

	auto *bitcast_op = impl.allocate(spv::OpBitcast, instruction);
	bitcast_op->add_id(narrow_op->id);
	impl.add(bitcast_op);

	return true;
}